

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_1000_1999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case1050(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Expectation *pEVar2;
  socklen_t __len;
  allocator<char> local_34a;
  allocator<char> local_349;
  string local_348;
  string local_328 [32];
  Expectation local_308;
  Expectation local_250;
  Decl local_198;
  Decl local_d0;
  
  std::__cxx11::string::string<std::allocator<char>>(local_328,"const int x ;",&local_349);
  Expectation::Expectation(&local_308);
  Decl::Decl(&local_198);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"x",&local_34a);
  __len = 0;
  pDVar1 = Decl::Object(&local_198,&local_348,VariableDeclaration,File);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,Const);
  Decl::Decl(&local_d0,pDVar1);
  pEVar2 = Expectation::declaration(&local_308,&local_d0);
  Expectation::Expectation(&local_250,pEVar2);
  bind(this,(int)local_328,(sockaddr *)&local_250,__len);
  Expectation::~Expectation(&local_250);
  Decl::~Decl(&local_d0);
  std::__cxx11::string::~string((string *)&local_348);
  Decl::~Decl(&local_198);
  Expectation::~Expectation(&local_308);
  std::__cxx11::string::~string(local_328);
  return;
}

Assistant:

void DeclarationBinderTester::case1050()
{
    bind("const int x ;",
         Expectation()
             .declaration(Decl().Object("x", SymbolKind::VariableDeclaration)
                      .ty_.Basic(BasicTypeKind::Int_S, CVR::Const)));
}